

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool testing::internal::TuplePrefix<3ul>::
     Matches<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<double>>,std::tuple<int,int,double>>
               (tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>
                *matcher_tuple,tuple<int,_int,_double> *value_tuple)

{
  bool bVar1;
  tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_> *in_RSI;
  double in_stack_00000008;
  MatcherBase<double> *in_stack_00000010;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  bool bVar2;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<double>>,std::tuple<int,int,double>>
                    (in_RSI,(tuple<int,_int,_double> *)
                            CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  bVar2 = false;
  if (bVar1) {
    std::get<2ul,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<double>>
              ((tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_> *)
               0x140466);
    std::get<2ul,int,int,double>((tuple<int,_int,_double> *)0x140475);
    bVar2 = MatcherBase<double>::Matches(in_stack_00000010,in_stack_00000008);
  }
  return bVar2;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }